

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithEnvironment
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler_,
          sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  sysbvm_functionBytecodeDirectCompiler_t *local_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_functionBytecodeDirectCompiler_t **local_30;
  
  local_30 = &local_60;
  local_58 = 0;
  sStack_50 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 3;
  local_60 = compiler_;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_58 = local_60->assembler->sourceEnvironment;
  local_60->assembler->sourceEnvironment = environment;
  sStack_50 = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context,local_60,astNode);
  local_60->assembler->sourceEnvironment = local_58;
  sysbvm_stackFrame_popRecord(&local_48);
  return sStack_50;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithEnvironment(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler_, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t oldEnvironment;
        sysbvm_tuple_t result;
    } gcFrame = {
        .compiler = compiler_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.oldEnvironment = gcFrame.compiler->assembler->sourceEnvironment;
    gcFrame.compiler->assembler->sourceEnvironment = environment;

    gcFrame.result = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, astNode);

    gcFrame.compiler->assembler->sourceEnvironment = gcFrame.oldEnvironment;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}